

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void tcg_context_init_sparc64(TCGContext_conflict8 *s)

{
  intptr_t *piVar1;
  tcg_target_long *ptVar2;
  uintptr_t *puVar3;
  TCGArgConstraint *pTVar4;
  byte bVar5;
  TCGOpDef *pTVar6;
  gpointer pvVar7;
  gpointer pvVar8;
  GHashTable *hash_table;
  GHashTable *pGVar9;
  undefined1 *puVar10;
  int *piVar11;
  jit_code_entry *pjVar12;
  ushort uVar13;
  long lVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  _Bool _Var18;
  ushort uVar19;
  ulong uVar20;
  byte *pbVar21;
  int oarg;
  uint uVar22;
  byte *pbVar23;
  TCGOpcode op;
  bool bVar24;
  uint in_XCR0;
  
  uVar17 = 0;
  memset(s,0,0xa7a0);
  pTVar6 = (TCGOpDef *)g_malloc0(0x1720);
  s->tcg_op_defs = pTVar6;
  memcpy(pTVar6,tcg_op_defs_org,0x1720);
  lVar14 = 9;
  do {
    uVar17 = (uint)*(byte *)((long)s->tcg_op_defs + lVar14 + -1) +
             *(byte *)((long)&s->tcg_op_defs->name + lVar14) + uVar17;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x1729);
  pvVar7 = g_malloc0((ulong)uVar17 * 8);
  pvVar8 = g_malloc0((ulong)uVar17 << 2);
  pTVar6 = s->tcg_op_defs;
  lVar14 = 0;
  do {
    *(gpointer *)((long)&pTVar6->args_ct + lVar14) = pvVar7;
    *(gpointer *)((long)&pTVar6->sorted_args + lVar14) = pvVar8;
    uVar20 = (ulong)((uint)(&pTVar6->nb_oargs)[lVar14] + (uint)(&pTVar6->nb_iargs)[lVar14]);
    pvVar8 = (gpointer)((long)pvVar8 + uVar20 * 4);
    pvVar7 = (gpointer)((long)pvVar7 + uVar20 * 8);
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x1720);
  lVar14 = 0;
  hash_table = g_hash_table_new((GHashFunc)0x0,(GEqualFunc)0x0);
  s->helper_table = hash_table;
  pGVar9 = g_hash_table_new_full
                     ((GHashFunc)0x0,(GEqualFunc)0x0,(GDestroyNotify)0x0,uc_free_inline_hook_info);
  s->custom_helper_infos = pGVar9;
  do {
    g_hash_table_insert(hash_table,*(gpointer *)((long)&all_helpers[0].func + lVar14),
                        (gpointer)((long)&all_helpers[0].func + lVar14));
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x2388);
  piVar11 = (int *)cpuid_basic_info(0);
  if (*piVar11 < 7) {
    if (*piVar11 < 1) goto LAB_00a1d016;
    _Var18 = false;
  }
  else {
    lVar14 = cpuid_Extended_Feature_Enumeration_info(7);
    bVar5 = (byte)*(undefined4 *)(lVar14 + 4);
    have_bmi1_sparc64 = (_Bool)(bVar5 >> 3 & 1);
    have_bmi2 = (_Bool)((byte)((uint)*(undefined4 *)(lVar14 + 4) >> 8) & 1);
    _Var18 = (_Bool)(bVar5 >> 5 & 1);
  }
  lVar14 = cpuid_Version_info(1);
  uVar17 = *(uint *)(lVar14 + 0xc);
  have_movbe = (_Bool)((byte)(uVar17 >> 0x16) & 1);
  have_popcnt_sparc64 = (_Bool)((byte)(uVar17 >> 0x17) & 1);
  if (((uVar17 >> 0x1b & 1) != 0) && ((~in_XCR0 & 6) == 0)) {
    have_avx1_sparc64 = (_Bool)((byte)(uVar17 >> 0x1c) & 1);
    have_avx2_sparc64 = _Var18;
  }
LAB_00a1d016:
  piVar11 = (int *)cpuid(0x8000000);
  if (0 < *piVar11) {
    lVar14 = cpuid(0x80000001);
    have_lzcnt = (_Bool)((byte)*(undefined4 *)(lVar14 + 0xc) >> 5 & 1);
  }
  s->tcg_target_available_regs[0] = 0xffff;
  s->tcg_target_available_regs[1] = 0xffff;
  if (have_avx1_sparc64 == true) {
    s->tcg_target_available_regs[2] = 0xffff0000;
    s->tcg_target_available_regs[3] = 0xffff0000;
  }
  if (have_avx2_sparc64 == true) {
    s->tcg_target_available_regs[4] = 0xffff0000;
  }
  s->tcg_target_call_clobber_regs = 0xffff0fc7;
  s->reserved_regs = 0x10;
  lVar14 = 0;
  do {
    bVar5 = s->tcg_op_defs[lVar14].flags;
    if ((bVar5 & 0x20) != 0) goto LAB_00a1d4d4;
    pTVar6 = s->tcg_op_defs + lVar14;
    uVar17 = (uint)pTVar6->nb_oargs + (uint)pTVar6->nb_iargs;
    if (uVar17 == 0) goto LAB_00a1d4d4;
    puVar10 = tcg_target_op_def_r;
    switch((uint)lVar14 & 0xff) {
    case 7:
    case 0x41:
      puVar10 = tcg_target_op_def_setc;
      break;
    case 8:
    case 0x42:
      puVar10 = tcg_target_op_def_movc;
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x23:
    case 0x24:
    case 0x30:
    case 0x32:
    case 0x3e:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x60:
    case 99:
    case 100:
    case 0x65:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6d:
    case 0x7a:
      puVar10 = tcg_target_op_def_r_r;
      break;
    case 0xe:
    case 0x4a:
      puVar10 = tcg_target_op_def_qi_r;
      break;
    case 0xf:
    case 0x10:
    case 0x4b:
    case 0x4c:
      puVar10 = tcg_target_op_def_ri_r;
      break;
    case 0x11:
    case 0x4e:
      puVar10 = tcg_target_op_def_r_r_re;
      break;
    case 0x12:
    case 0x13:
    case 0x1b:
    case 0x1c:
    case 0x4f:
    case 0x50:
    case 0x58:
    case 0x59:
      puVar10 = tcg_target_op_def_r_0_re;
      break;
    default:
      puVar10 = (undefined1 *)0x0;
      break;
    case 0x18:
    case 0x19:
    case 0x55:
    case 0x56:
      puVar10 = tcg_target_op_def_div2;
      break;
    case 0x1a:
    case 0x57:
      puVar10 = tcg_target_op_def_and;
      break;
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x5a:
    case 0x5b:
    case 0x5c:
      puVar10 = tcg_target_op_def_r_0_ci;
      if (have_bmi2 != false) {
        puVar10 = tcg_target_op_def_r_r_ri;
      }
      break;
    case 0x20:
    case 0x21:
    case 0x5d:
    case 0x5e:
      puVar10 = tcg_target_op_def_r_0_ci;
      break;
    case 0x22:
    case 0x5f:
      puVar10 = tcg_target_op_def_dep;
      break;
    case 0x25:
    case 0x62:
      puVar10 = tcg_target_op_def_r_0_r;
      break;
    case 0x26:
    case 0x67:
      puVar10 = tcg_target_op_def_r_re;
      break;
    case 0x27:
    case 0x28:
    case 0x7b:
    case 0x7c:
      puVar10 = tcg_target_op_def_arith2;
      break;
    case 0x29:
    case 0x2a:
    case 0x7d:
    case 0x7e:
      puVar10 = tcg_target_op_def_mul2;
      break;
    case 0x2d:
      puVar10 = tcg_target_op_def_b2;
      break;
    case 0x2e:
      puVar10 = tcg_target_op_def_s2;
      break;
    case 0x2f:
    case 0x31:
    case 0x68:
    case 0x6b:
      puVar10 = tcg_target_op_def_r_q;
      break;
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x66:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
      puVar10 = tcg_target_op_def_r_0;
      break;
    case 0x37:
    case 0x73:
      puVar10 = tcg_target_op_def_andc;
      break;
    case 0x3c:
    case 0x78:
      uVar22 = (uint)have_lzcnt * 0x88;
      puVar10 = tcg_target_op_def_clz;
      goto LAB_00a1d201;
    case 0x3d:
    case 0x79:
      uVar22 = (uint)have_bmi1_sparc64 * 0x80 + (uint)have_bmi1_sparc64 * 8;
      puVar10 = tcg_target_op_def_ctz;
LAB_00a1d201:
      puVar10 = puVar10 + uVar22;
      break;
    case 0x4d:
      puVar10 = tcg_target_op_def_re_r;
      break;
    case 0x84:
      break;
    case 0x85:
    case 0x87:
      puVar10 = tcg_target_op_def_r_L;
      break;
    case 0x86:
    case 0x88:
      puVar10 = tcg_target_op_def_L_L;
      break;
    case 0x8b:
    case 0x94:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xb5:
      puVar10 = tcg_target_op_def_x_x;
      break;
    case 0x8d:
    case 0x8e:
    case 0x8f:
      puVar10 = tcg_target_op_def_x_r;
      break;
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x95:
    case 0x96:
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
    case 0xa0:
    case 0xa6:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xb0:
    case 0xb2:
    case 0xb3:
    case 0xb4:
    case 0xb6:
    case 0xb7:
    case 0xb8:
      puVar10 = tcg_target_op_def_x_x_x;
      break;
    case 0xb1:
      puVar10 = tcg_target_op_def_x_x_x_x;
    }
    bVar24 = (bVar5 & 0x10) == 0;
    uVar13 = 0x400;
    if (bVar24) {
      uVar13 = 2;
    }
    uVar15 = 0x200;
    if (bVar24) {
      uVar15 = 2;
    }
    uVar19 = 0x100;
    if (bVar24) {
      uVar19 = 2;
    }
    uVar20 = 0;
    do {
      pbVar21 = *(byte **)(puVar10 + uVar20 * 8 + 8);
      pTVar6->args_ct[uVar20].u.regs = 0;
      pTVar6->args_ct[uVar20].ct = 0;
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              bVar5 = *pbVar21;
              uVar22 = bVar5 - 0x30;
              if (9 < uVar22) break;
              pTVar6->args_ct[uVar20] = pTVar6->args_ct[uVar22];
              pTVar4 = pTVar6->args_ct;
              pTVar4[uVar22].ct = pTVar4[uVar22].ct | 0x80;
              pTVar4[uVar22].alias_index = (uint8_t)uVar20;
              *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 0x40;
              pTVar4[uVar20].alias_index = (uint8_t)uVar22;
              pbVar21 = pbVar21 + 1;
            }
            if (bVar5 != 0x26) break;
            pTVar6->args_ct[uVar20].ct = pTVar6->args_ct[uVar20].ct | 0x20;
            pbVar21 = pbVar21 + 1;
          }
          if (bVar5 != 0x69) break;
          pTVar6->args_ct[uVar20].ct = pTVar6->args_ct[uVar20].ct | 2;
          pbVar21 = pbVar21 + 1;
        }
        if (bVar5 == 0) break;
        pTVar4 = pTVar6->args_ct;
        pbVar23 = pbVar21 + 1;
        pbVar21 = pbVar23;
        if (bVar5 < 0x51) {
          if (bVar5 == 0x44) {
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            *(byte *)&pTVar4[uVar20].u = *(byte *)&pTVar4[uVar20].u | 0x80;
          }
          else if (bVar5 == 0x49) {
            pTVar4[uVar20].ct = pTVar4[uVar20].ct | uVar13;
          }
          else {
            pbVar21 = (byte *)0x0;
            if (bVar5 == 0x4c) {
              *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
              pTVar4[uVar20].u.regs = 0xff3f;
              pbVar21 = pbVar23;
            }
          }
        }
        else if (bVar5 < 0x71) {
          pbVar21 = (byte *)0x0;
          switch(bVar5) {
          case 0x51:
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            pTVar4[uVar20].u.regs = 0xf;
            pbVar21 = pbVar23;
            break;
          case 0x53:
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            *(byte *)&pTVar4[uVar20].u = *(byte *)&pTVar4[uVar20].u | 0x40;
            pbVar21 = pbVar23;
            break;
          case 0x57:
            pbVar21 = (byte *)((long)&pTVar4[uVar20].ct + 1);
            *pbVar21 = *pbVar21 | 8;
            pbVar21 = pbVar23;
            break;
          case 0x5a:
            pTVar4[uVar20].ct = pTVar4[uVar20].ct | uVar15;
            pbVar21 = pbVar23;
            break;
          case 0x61:
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            *(byte *)&pTVar4[uVar20].u = *(byte *)&pTVar4[uVar20].u | 1;
            pbVar21 = pbVar23;
            break;
          case 0x62:
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            *(byte *)&pTVar4[uVar20].u = *(byte *)&pTVar4[uVar20].u | 8;
            pbVar21 = pbVar23;
            break;
          case 99:
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            *(byte *)&pTVar4[uVar20].u = *(byte *)&pTVar4[uVar20].u | 2;
            pbVar21 = pbVar23;
            break;
          case 100:
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            *(byte *)&pTVar4[uVar20].u = *(byte *)&pTVar4[uVar20].u | 4;
            pbVar21 = pbVar23;
            break;
          case 0x65:
            pTVar4[uVar20].ct = pTVar4[uVar20].ct | uVar19;
            pbVar21 = pbVar23;
          }
        }
        else if (bVar5 == 0x71) {
          *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
          pTVar4[uVar20].u.regs = 0xffff;
        }
        else if (bVar5 == 0x72) {
          *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
          pTVar4[uVar20].u.regs = pTVar4[uVar20].u.regs | 0xffff;
        }
        else {
          pbVar21 = (byte *)0x0;
          if (bVar5 == 0x78) {
            *(byte *)&pTVar4[uVar20].ct = (byte)pTVar4[uVar20].ct | 1;
            pTVar4[uVar20].u.regs = pTVar4[uVar20].u.regs | 0xffff0000;
            pbVar21 = pbVar23;
          }
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar17);
    sort_constraints(pTVar6,0,(uint)pTVar6->nb_oargs);
    sort_constraints(pTVar6,(uint)pTVar6->nb_oargs,(uint)pTVar6->nb_iargs);
LAB_00a1d4d4:
    lVar14 = lVar14 + 1;
    if (lVar14 == 0xb9) {
      piVar11 = (int *)g_malloc(0x7c);
      s->indirect_reg_alloc_order = piVar11;
      lVar14 = 0x1e;
      do {
        *piVar11 = tcg_target_reg_alloc_order[lVar14];
        piVar11 = piVar11 + 1;
        bVar24 = lVar14 != 0;
        lVar14 = lVar14 + -1;
      } while (bVar24);
      pjVar12 = (jit_code_entry *)g_malloc(0x20);
      s->one_entry = pjVar12;
      pjVar12->symfile_addr = (void *)0x0;
      uVar20 = (ulong)(uint)s->nb_globals;
      uVar17 = s->reserved_regs;
      iVar16 = s->nb_globals + 1;
      s->nb_globals = iVar16;
      s->nb_temps = iVar16;
      piVar1 = &s->temps[uVar20].mem_offset;
      *piVar1 = 0;
      piVar1[1] = 0;
      ptVar2 = &s->temps[uVar20].val;
      *ptVar2 = 0;
      ptVar2[1] = 0;
      puVar3 = &s->temps[uVar20].state;
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined8 *)(s->temps + uVar20) = 0x2101010005;
      s->temps[uVar20].name = "env";
      s->reserved_regs = uVar17 | 0x20;
      s->cpu_env = (TCGv_ptr)(uVar20 * 0x38 + 0x388);
      return;
    }
  } while( true );
}

Assistant:

void tcg_context_init(TCGContext *s)
{
    int op, total_args, n, i;
    TCGOpDef *def;
    TCGArgConstraint *args_ct;
    int *sorted_args;
    TCGTemp *ts;
    GHashTable *helper_table;

    memset(s, 0, sizeof(*s));
    s->nb_globals = 0;

    // copy original tcg_op_defs_org for private usage
    s->tcg_op_defs = g_malloc0(sizeof(tcg_op_defs_org));
    memcpy(s->tcg_op_defs, tcg_op_defs_org, sizeof(tcg_op_defs_org));

    /* Count total number of arguments and allocate the corresponding
       space */
    total_args = 0;
    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        n = def->nb_iargs + def->nb_oargs;
        total_args += n;
    }

    args_ct = g_malloc0(sizeof(TCGArgConstraint) * total_args);
    sorted_args = g_malloc0(sizeof(int) * total_args);

    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        def->args_ct = args_ct;
        def->sorted_args = sorted_args;
        n = def->nb_iargs + def->nb_oargs;
        sorted_args += n;
        args_ct += n;
    }

    /* Register helpers.  */
    /* Use g_direct_hash/equal for direct pointer comparisons on func.  */
    helper_table = g_hash_table_new(NULL, NULL);
    s->helper_table = helper_table;

    // Unicorn: Store our custom inline hooks infomation
    s->custom_helper_infos = g_hash_table_new_full(NULL, NULL, NULL, uc_free_inline_hook_info);

    for (i = 0; i < ARRAY_SIZE(all_helpers); ++i) {
        g_hash_table_insert(helper_table, (gpointer)all_helpers[i].func,
                            (gpointer)&all_helpers[i]);
    }

    tcg_target_init(s);
    process_op_defs(s);

    /* Reverse the order of the saved registers, assuming they're all at
       the start of tcg_target_reg_alloc_order.  */
    for (n = 0; n < ARRAY_SIZE(tcg_target_reg_alloc_order); ++n) {
        int r = tcg_target_reg_alloc_order[n];
        if (tcg_regset_test_reg(s->tcg_target_call_clobber_regs, r)) {
            break;
        }
    }
    n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    s->indirect_reg_alloc_order = g_malloc(sizeof(int) * n);
    for (i = 0; i < n; ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[n - 1 - i];
    }
    for (; i < ARRAY_SIZE(tcg_target_reg_alloc_order); ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[i];
    }

    s->one_entry = g_malloc(sizeof(struct jit_code_entry));
    s->one_entry->symfile_addr = NULL;

    tcg_debug_assert(!tcg_regset_test_reg(s->reserved_regs, TCG_AREG0));
    ts = tcg_global_reg_new_internal(s, TCG_TYPE_PTR, TCG_AREG0, "env");
    s->cpu_env = temp_tcgv_ptr(s, ts);
}